

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3CodeVerifyNamedSchema(Parse *pParse,char *zDb)

{
  sqlite3 *psVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  psVar1 = pParse->db;
  if (0 < psVar1->nDb) {
    lVar3 = 8;
    lVar4 = 0;
    do {
      if (*(long *)((long)&psVar1->aDb->zDbSName + lVar3) != 0) {
        if (zDb != (char *)0x0) {
          iVar2 = sqlite3StrICmp(zDb,*(char **)((long)psVar1->aDb + lVar3 + -8));
          if (iVar2 != 0) goto LAB_00176a69;
        }
        sqlite3CodeVerifySchema(pParse,(int)lVar4);
      }
LAB_00176a69:
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while (lVar4 < psVar1->nDb);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeVerifyNamedSchema(Parse *pParse, const char *zDb){
  sqlite3 *db = pParse->db;
  int i;
  for(i=0; i<db->nDb; i++){
    Db *pDb = &db->aDb[i];
    if( pDb->pBt && (!zDb || 0==sqlite3StrICmp(zDb, pDb->zDbSName)) ){
      sqlite3CodeVerifySchema(pParse, i);
    }
  }
}